

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

void __thiscall
Database::commit_task
          (Database *this,TaskSpec *spec,vector<DBChange,_std::allocator<DBChange>_> *changes)

{
  int iVar1;
  pointer pcVar2;
  char *__nptr;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  long *plVar3;
  logger *plVar4;
  OnDiskDataset *this_00;
  long lVar5;
  int *piVar6;
  ulonglong uVar7;
  ulonglong file_offset;
  runtime_error *prVar8;
  undefined8 uVar9;
  uint *puVar10;
  pointer pDVar11;
  string_view_t fmt;
  string_view_t fmt_00;
  string_view value;
  string param;
  DatabaseName itname;
  long *local_1d8;
  ConfigKey *pCStack_1d0;
  long local_1c8 [2];
  long *local_1b8;
  undefined8 uStack_1b0;
  long local_1a8 [3];
  long *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  path *local_180;
  DatabaseName local_178;
  vector<DBChange,_std::allocator<DBChange>_> *local_d8;
  pointer local_d0;
  DatabaseConfig *local_c8;
  Database *local_c0;
  pointer local_b8;
  path local_b0;
  path local_70;
  
  local_d0 = (pointer)spec->id_;
  pDVar11 = (changes->super__Vector_base<DBChange,_std::allocator<DBChange>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_b8 = (changes->super__Vector_base<DBChange,_std::allocator<DBChange>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_d8 = changes;
  if (pDVar11 != local_b8) {
    local_c8 = &this->config_;
    local_180 = &this->db_base;
    local_188 = &local_178.filename.field_2;
    local_c0 = this;
    do {
      if ((pDVar11->parameter)._M_string_length == 0) {
        db_change_to_string_abi_cxx11_((string *)&local_178,pDVar11->type);
        plVar4 = spdlog::default_logger_raw();
        local_1d8 = (long *)0x0;
        pCStack_1d0 = (ConfigKey *)0x0;
        local_1c8[0] = 0;
        loc_00.funcname = (char *)0x0;
        loc_00.filename = (char *)0x0;
        loc_00.line = 0;
        loc_00._12_4_ = 0;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = "CHANGE: {} {}";
        spdlog::logger::log<std::__cxx11::string,std::__cxx11::string>
                  (plVar4,loc_00,info,fmt_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   &pDVar11->obj_name);
      }
      else {
        db_change_to_string_abi_cxx11_((string *)&local_178,pDVar11->type);
        plVar4 = spdlog::default_logger_raw();
        local_1d8 = (long *)0x0;
        pCStack_1d0 = (ConfigKey *)0x0;
        local_1c8[0] = 0;
        loc.funcname = (char *)0x0;
        loc.filename = (char *)0x0;
        loc.line = 0;
        loc._12_4_ = 0;
        fmt.size_ = 0x12;
        fmt.data_ = "CHANGE: {} {} ({})";
        spdlog::logger::log<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (plVar4,loc,info,fmt,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   &pDVar11->obj_name,&pDVar11->parameter);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178.db_base._M_pathname._M_dataplus._M_p !=
          &local_178.db_base._M_pathname.field_2) {
        operator_delete(local_178.db_base._M_pathname._M_dataplus._M_p,
                        local_178.db_base._M_pathname.field_2._M_allocated_capacity + 1);
      }
      puVar10 = &switchD_00115ffc::switchdataD_00198220;
      switch(pDVar11->type) {
      case Insert:
        goto LAB_001160cc;
      case Drop:
        drop_dataset(this,&pDVar11->obj_name);
        break;
      case Reload:
        drop_dataset(this,&pDVar11->obj_name);
LAB_001160cc:
        load_dataset(this,&pDVar11->obj_name);
        break;
      case ToggleTaint:
        this_00 = find_working_dataset(this,&pDVar11->obj_name);
        if (this_00 == (OnDiskDataset *)0x0) {
          plVar4 = spdlog::default_logger_raw();
          local_178.db_base._M_pathname._M_dataplus._M_p = (char *)0x0;
          local_178.db_base._M_pathname._M_string_length = 0;
          local_178.db_base._M_pathname.field_2._M_allocated_capacity = 0;
          loc_02.funcname = (char *)0x0;
          loc_02.filename = (char *)0x0;
          loc_02.line = 0;
          loc_02._12_4_ = 0;
          spdlog::logger::log<char[41],_nullptr>
                    (plVar4,loc_02,warn,(char (*) [41])"ToggleTaint failed - nonexistent dataset");
        }
        else {
          OnDiskDataset::toggle_taint(this_00,&pDVar11->parameter);
          OnDiskDataset::save(this_00);
        }
        break;
      case NewIterator:
        std::experimental::filesystem::v1::__cxx11::path::path(&local_70,local_180);
        DatabaseName::parse(&local_178,&local_70,&pDVar11->obj_name);
        std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
        load_iterator(this,&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178.filename._M_dataplus._M_p != local_188) {
LAB_00116050:
          operator_delete(local_178.filename._M_dataplus._M_p,
                          local_178.filename.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00116060;
      case UpdateIterator:
        std::experimental::filesystem::v1::__cxx11::path::path(&local_b0,local_180);
        DatabaseName::parse(&local_178,&local_b0,&pDVar11->obj_name);
        std::experimental::filesystem::v1::__cxx11::path::~path(&local_b0);
        pcVar2 = (pDVar11->parameter)._M_dataplus._M_p;
        local_1d8 = local_1c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,pcVar2,pcVar2 + (pDVar11->parameter)._M_string_length);
        lVar5 = std::__cxx11::string::find((char)(string *)&local_1d8,0x3a);
        if (lVar5 == -1) goto LAB_00116511;
        std::__cxx11::string::substr((ulong)&local_1b8,(ulong)&local_1d8);
        plVar3 = local_1b8;
        piVar6 = __errno_location();
        iVar1 = *piVar6;
        *piVar6 = 0;
        uVar7 = strtoull((char *)plVar3,(char **)&local_190,10);
        if (local_190 == plVar3) goto LAB_00116505;
        if (*piVar6 == 0) {
          *piVar6 = iVar1;
        }
        else if (*piVar6 == 0x22) goto LAB_0011654f;
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
        std::__cxx11::string::substr((ulong)&local_1b8,(ulong)&local_1d8);
        plVar3 = local_1b8;
        iVar1 = *piVar6;
        *piVar6 = 0;
        file_offset = strtoull((char *)local_1b8,(char **)&local_190,10);
        if (local_190 == plVar3) goto LAB_001164f9;
        if (*piVar6 == 0) {
          *piVar6 = iVar1;
        }
        else if (*piVar6 == 0x22) goto LAB_0011655b;
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
        this = local_c0;
        update_iterator(local_c0,&local_178,uVar7,file_offset);
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178.filename._M_dataplus._M_p != local_188) goto LAB_00116050;
LAB_00116060:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178.id._M_dataplus._M_p != &local_178.id.field_2) {
          operator_delete(local_178.id._M_dataplus._M_p,
                          local_178.id.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178.type._M_dataplus._M_p != &local_178.type.field_2) {
          operator_delete(local_178.type._M_dataplus._M_p,
                          local_178.type.field_2._M_allocated_capacity + 1);
        }
        std::experimental::filesystem::v1::__cxx11::path::~path(&local_178.db_base);
        break;
      case ConfigChange:
        pcVar2 = (pDVar11->obj_name)._M_dataplus._M_p;
        local_1d8 = local_1c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,pcVar2,pcVar2 + (pDVar11->obj_name)._M_string_length);
        __nptr = (pDVar11->parameter)._M_dataplus._M_p;
        piVar6 = __errno_location();
        iVar1 = *piVar6;
        *piVar6 = 0;
        uVar7 = strtoull(__nptr,(char **)&local_178,10);
        if (local_178.db_base._M_pathname._M_dataplus._M_p == __nptr) {
          std::__throw_invalid_argument("stoull");
LAB_001164f9:
          std::__throw_invalid_argument("stoull");
LAB_00116505:
          std::__throw_invalid_argument("stoull");
LAB_00116511:
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar8,"Invalid iterator update parameter");
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (*piVar6 == 0) {
          *piVar6 = iVar1;
        }
        else if (*piVar6 == 0x22) {
          std::__throw_out_of_range("stoull");
LAB_0011654f:
          std::__throw_out_of_range("stoull");
LAB_0011655b:
          uVar9 = std::__throw_out_of_range("stoull");
          if (local_1d8 != local_1c8) {
            operator_delete(local_1d8,local_1c8[0] + 1);
          }
          DatabaseName::~DatabaseName(&local_178);
          _Unwind_Resume(uVar9);
        }
        value._M_str = (char *)puVar10;
        value._M_len = (size_t)local_1d8;
        ConfigKey::parse((optional<ConfigKey> *)&local_178,pCStack_1d0,value);
        if (local_178.db_base._M_type == _Root_name) {
          DatabaseConfig::set(local_c8,(ConfigKey *)&local_178,uVar7);
        }
        else {
          plVar4 = spdlog::default_logger_raw();
          local_1b8 = (long *)0x0;
          uStack_1b0 = 0;
          local_1a8[0] = 0;
          loc_01.funcname = (char *)0x0;
          loc_01.filename = (char *)0x0;
          loc_01.line = 0;
          loc_01._12_4_ = 0;
          spdlog::logger::log<char[36],_nullptr>
                    (plVar4,loc_01,err,(char (*) [36])"Invalid key name in DbChange - bug?");
        }
        if ((local_178.db_base._M_type == _Root_name) &&
           (local_178.db_base._M_type = _Multi,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_178.db_base._M_pathname._M_dataplus._M_p !=
           &local_178.db_base._M_pathname.field_2)) {
          operator_delete(local_178.db_base._M_pathname._M_dataplus._M_p,
                          local_178.db_base._M_pathname.field_2._M_allocated_capacity + 1);
        }
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        break;
      default:
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"unknown change type requested");
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pDVar11 = pDVar11 + 1;
    } while (pDVar11 != local_b8);
  }
  if ((local_d8->super__Vector_base<DBChange,_std::allocator<DBChange>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (local_d8->super__Vector_base<DBChange,_std::allocator<DBChange>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    save(this);
  }
  local_178.db_base._M_pathname._M_dataplus._M_p = local_d0;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->tasks)._M_h);
  return;
}

Assistant:

void Database::commit_task(const TaskSpec &spec,
                           const std::vector<DBChange> &changes) {
    uint64_t task_id = spec.id();

    for (const auto &change : changes) {
        if (change.parameter.empty()) {
            spdlog::info("CHANGE: {} {}", db_change_to_string(change.type),
                         change.obj_name);
        } else {
            spdlog::info("CHANGE: {} {} ({})", db_change_to_string(change.type),
                         change.obj_name, change.parameter);
        }
        if (change.type == DbChangeType::Insert) {
            load_dataset(change.obj_name);
        } else if (change.type == DbChangeType::Drop) {
            drop_dataset(change.obj_name);
        } else if (change.type == DbChangeType::Reload) {
            drop_dataset(change.obj_name);
            load_dataset(change.obj_name);
        } else if (change.type == DbChangeType::ToggleTaint) {
            OnDiskDataset *ds = find_working_dataset(change.obj_name);
            if (ds == nullptr) {
                spdlog::warn("ToggleTaint failed - nonexistent dataset");
                continue;  // suspicious, but maybe task was delayed?
            }
            ds->toggle_taint(change.parameter);
            ds->save();
        } else if (change.type == DbChangeType::NewIterator) {
            DatabaseName itname = DatabaseName::parse(db_base, change.obj_name);
            load_iterator(itname);
        } else if (change.type == DbChangeType::UpdateIterator) {
            DatabaseName itname = DatabaseName::parse(db_base, change.obj_name);
            std::string param = change.parameter;
            size_t split_loc = param.find(':');
            if (split_loc == std::string::npos) {
                throw std::runtime_error("Invalid iterator update parameter");
            }
            uint64_t new_bytes = std::stoull(param.substr(0, split_loc));
            uint64_t new_files = std::stoull(param.substr(split_loc + 1));
            update_iterator(itname, new_bytes, new_files);
        } else if (change.type == DbChangeType::ConfigChange) {
            std::string keyname = change.obj_name;
            uint64_t value = std::stoull(change.parameter);
            auto key = ConfigKey::parse(keyname);
            if (key) {
                config_.set(*key, value);
            } else {
                spdlog::error("Invalid key name in DbChange - bug?");
            }
        } else {
            throw std::runtime_error("unknown change type requested");
        }
    }

    if (!changes.empty()) {
        save();
    }

    erase_task(task_id);
}